

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O2

BOOLEAN __thiscall BVStatic<272UL>::TestRange(BVStatic<272UL> *this,BVIndex index,uint length)

{
  BVUnit *pBVar1;
  sbyte sVar2;
  uint uVar3;
  bool bVar4;
  
  AssertRange(this,index);
  AssertRange(this,(index + length) - 1);
  pBVar1 = BitsFromIndex(this,index);
  sVar2 = (sbyte)(index & 0x3f);
  if ((index & 0x3f) + length < 0x41) {
    bVar4 = ((0xffffffffffffffffU >> (-(char)length & 0x3fU)) << sVar2 & ~pBVar1->word) == 0;
  }
  else {
    if ((ulong)(-1L << sVar2) <= pBVar1->word) {
      for (uVar3 = (index | 0xffffffc0) + length; pBVar1 = pBVar1 + 1, 0x3f < uVar3;
          uVar3 = uVar3 - 0x40) {
        if (pBVar1->word != 0xffffffffffffffff) goto LAB_0066eeb1;
      }
      if ((uVar3 == 0) || (~pBVar1->word << (-(char)uVar3 & 0x3fU) == 0)) {
        return '\x01';
      }
    }
LAB_0066eeb1:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

BOOLEAN TestRange(const BVIndex index, uint length) const
    {
        AssertRange(index);
        AssertRange(index + length - 1);

        const BVUnit * bvUnit = BitsFromIndex(index);
        uint offset = BVUnit::Offset(index);

        if (offset + length <= BVUnit::BitsPerWord)
        {
            // Bit range is in a single word
            return bvUnit->TestRange(offset, length);
        }

        // Bit range spans words.
        // Test the first word, from start offset to end of word
        if (!bvUnit->TestRange(offset, (BVUnit::BitsPerWord - offset)))
        {
            return FALSE;
        }

        bvUnit++;
        length -= (BVUnit::BitsPerWord - offset);

        // Test entire words until we are at the last word
        while (length >= BVUnit::BitsPerWord)
        {
            if (!bvUnit->IsFull())
            {
                return FALSE;
            }

            bvUnit++;
            length -= BVUnit::BitsPerWord;
        }

        // Test last word (unless we already ended on a word boundary)
        if (length > 0)
        {
            if (!bvUnit->TestRange(0, length))
            {
                return FALSE;
            }
        }

        return TRUE;
    }